

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

size_t absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                 (size_t hash,size_t slot_size,CommonFields *common)

{
  ulong i;
  h2_t h;
  size_t sVar1;
  size_t sVar2;
  ctrl_t *ctrl;
  GrowthInfo *this;
  HashtablezInfoHandle local_29;
  ulong local_28;
  size_t offset;
  CommonFields *common_local;
  size_t slot_size_local;
  size_t hash_local;
  
  offset = (size_t)common;
  common_local = (CommonFields *)slot_size;
  slot_size_local = hash;
  sVar1 = CommonFields::capacity(common);
  sVar2 = SooCapacity();
  sVar2 = NextCapacity(sVar2);
  if (sVar1 != sVar2) {
    __assert_fail("common.capacity() == NextCapacity(SooCapacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x85,
                  "size_t absl::container_internal::PrepareInsertAfterSoo(size_t, size_t, CommonFields &)"
                 );
  }
  sVar1 = HashSetResizeHelper::SooSlotIndex();
  if (sVar1 == 1) {
    PrepareInsertCommon((CommonFields *)offset);
    sVar1 = slot_size_local;
    ctrl = CommonFields::control((CommonFields *)offset);
    sVar1 = H1(sVar1,ctrl);
    local_28 = sVar1 & 2;
    this = CommonFields::growth_info((CommonFields *)offset);
    GrowthInfo::OverwriteEmptyAsFull(this);
    sVar1 = offset;
    i = local_28;
    h = H2(slot_size_local);
    SetCtrlInSingleGroupTable((CommonFields *)sVar1,i,h,(size_t)common_local);
    CommonFields::infoz((CommonFields *)offset);
    HashtablezInfoHandle::RecordInsert(&local_29,slot_size_local,0);
    return local_28;
  }
  __assert_fail("HashSetResizeHelper::SooSlotIndex() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x88,
                "size_t absl::container_internal::PrepareInsertAfterSoo(size_t, size_t, CommonFields &)"
               );
}

Assistant:

size_t PrepareInsertAfterSoo(size_t hash, size_t slot_size,
                             CommonFields& common) {
  assert(common.capacity() == NextCapacity(SooCapacity()));
  // After resize from capacity 1 to 3, we always have exactly the slot with
  // index 1 occupied, so we need to insert either at index 0 or index 2.
  assert(HashSetResizeHelper::SooSlotIndex() == 1);
  PrepareInsertCommon(common);
  const size_t offset = H1(hash, common.control()) & 2;
  common.growth_info().OverwriteEmptyAsFull();
  SetCtrlInSingleGroupTable(common, offset, H2(hash), slot_size);
  common.infoz().RecordInsert(hash, /*distance_from_desired=*/0);
  return offset;
}